

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::ClearEntryPoints(FunctionBody *this)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  Type pcVar2;
  EntryPointInfo *this_00;
  int iVar3;
  uint32 uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  pSVar1 = (this->entryPoints).ptr;
  if (pSVar1 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    iVar3 = (pSVar1->
            super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ).
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
            .count;
    if (0 < iVar3) {
      lVar8 = 0;
      do {
        pcVar2 = (((pSVar1->
                   super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ).
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                   .buffer.ptr[lVar8].ptr)->super_RecyclerWeakReferenceBase).strongRef;
        if (pcVar2 != (Type)0x0) {
          (*(code *)**(undefined8 **)pcVar2)(pcVar2,0);
          iVar3 = (pSVar1->
                  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ).
                  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                  .count;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar3);
    }
    pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
    if (pvVar5 != (void *)0x0) {
      uVar4 = GetCountField(this,LoopCount);
      if (uVar4 != 0) {
        uVar7 = 0;
        do {
          lVar8 = *(long *)((long)pvVar5 + uVar7 * 0x30);
          if (lVar8 != 0) {
            iVar3 = *(int *)(lVar8 + 0x10);
            if (0 < iVar3) {
              lVar6 = 0;
              do {
                this_00 = *(EntryPointInfo **)(*(long *)(lVar8 + 8) + lVar6 * 8);
                if (this_00 != (EntryPointInfo *)0x0) {
                  EntryPointInfo::Cleanup(this_00,false,true);
                  iVar3 = *(int *)(lVar8 + 0x10);
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < iVar3);
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar4);
      }
    }
  }
  pSVar1 = (this->entryPoints).ptr;
  lVar8 = (long)(pSVar1->
                super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                .count;
  if (lVar8 != 0) {
    memset((pSVar1->
           super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ).
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
           .buffer.ptr,0,lVar8 << 3);
    (pSVar1->
    super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ).
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
    .count = 0;
  }
  return;
}

Assistant:

void FunctionBody::ClearEntryPoints()
    {
        if (this->entryPoints)
        {
            this->MapEntryPoints([] (int index, FunctionEntryPointInfo* entryPoint)
            {
                if (nullptr != entryPoint)
                {
                    // Finalize = Free up work item if it hasn't been released yet + entry point clean up
                    // isShutdown is false because cleanup is called only in the !isShutdown case
                    entryPoint->Finalize(/*isShutdown*/ false);
                }
            });

            this->MapLoopHeaders([] (uint loopNumber, LoopHeader* header)
            {
                header->MapEntryPoints([] (int index, LoopEntryPointInfo* entryPoint)
                {
                    entryPoint->Cleanup(/*isShutdown*/ false, true /* capture cleanup stack */);
                });
            });
        }

        this->entryPoints->ClearAndZero();
    }